

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O0

int fits_img_stats_int(int *array,long nx,long ny,int nullcheck,int nullvalue,long *ngoodpix,
                      int *minvalue,int *maxvalue,double *mean,double *sigma,double *noise1,
                      double *noise2,double *noise3,double *noise5,int *status)

{
  long unaff_RBX;
  double *in_RSI;
  undefined8 in_RDI;
  undefined8 *in_R9;
  long unaff_R14;
  int *unaff_R15;
  undefined4 *in_stack_00000008;
  int *in_stack_00000010;
  undefined8 *in_stack_00000018;
  undefined8 *in_stack_00000020;
  undefined8 *in_stack_00000028;
  undefined8 *in_stack_00000030;
  double xnoise5;
  double xnoise3;
  double xnoise2;
  double xnoise;
  double xsigma;
  double xmean;
  int maxval;
  int minval;
  long ngood;
  double *in_stack_000000a0;
  int *in_stack_000000a8;
  double *in_stack_ffffffffffffff70;
  long *in_stack_ffffffffffffff78;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 local_48;
  
  uVar5 = 0;
  uVar4 = 0;
  uVar3 = 0;
  uVar2 = 0;
  uVar1 = 0;
  if ((in_stack_00000018 != (undefined8 *)0x0) || (in_stack_00000020 != (undefined8 *)0x0)) {
    FnMeanSigma_int((int *)0x0,0,0,0,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                    (double *)0x0,(int *)0x0);
    if (in_R9 != (undefined8 *)0x0) {
      *in_R9 = local_48;
    }
    if (in_stack_00000018 != (undefined8 *)0x0) {
      *in_stack_00000018 = uVar5;
    }
    if (in_stack_00000020 != (undefined8 *)0x0) {
      *in_stack_00000020 = uVar4;
    }
  }
  if (in_stack_00000028 != (undefined8 *)0x0) {
    FnNoise1_int(unaff_R15,unaff_R14,unaff_RBX,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_RSI,
                 in_stack_00000010);
    *in_stack_00000028 = 0;
  }
  if (((in_stack_00000008 != (undefined4 *)0x0) || (in_stack_00000010 != (int *)0x0)) ||
     (xnoise5 != 0.0)) {
    FnNoise5_int(_maxval,(long)xmean,(long)xsigma,xnoise._4_4_,xnoise._0_4_,(long *)xnoise2,
                 (int *)CONCAT44(nullcheck,nullvalue),(int *)ny,(double *)nx,(double *)array,
                 in_stack_000000a0,in_stack_000000a8);
    if (in_R9 != (undefined8 *)0x0) {
      *in_R9 = local_48;
    }
    if (in_stack_00000008 != (undefined4 *)0x0) {
      *in_stack_00000008 = 0;
    }
    if (in_stack_00000010 != (int *)0x0) {
      *in_stack_00000010 = 0;
    }
    if (in_stack_00000030 != (undefined8 *)0x0) {
      *in_stack_00000030 = uVar3;
    }
    if (xnoise5 != 0.0) {
      *(undefined8 *)xnoise5 = uVar2;
    }
    if (xnoise3 != 0.0) {
      *(undefined8 *)xnoise3 = uVar1;
    }
  }
  return *(int *)xnoise2;
}

Assistant:

int fits_img_stats_int(int *array, /*  2 dimensional array of image pixels */
        long nx,            /* number of pixels in each row of the image */
	long ny,            /* number of rows in the image */
	                    /* (if this is a 3D image, then ny should be the */
			    /* product of the no. of rows times the no. of planes) */
	int nullcheck,      /* check for null values, if true */
	int nullvalue,    /* value of null pixels, if nullcheck is true */

   /* returned parameters (if the pointer is not null)  */
	long *ngoodpix,     /* number of non-null pixels in the image */
	int *minvalue,    /* returned minimum non-null value in the array */
	int *maxvalue,    /* returned maximum non-null value in the array */
	double *mean,       /* returned mean value of all non-null pixels */
	double *sigma,      /* returned R.M.S. value of all non-null pixels */
	double *noise1,     /* 1st order estimate of noise in image background level */
	double *noise2,     /* 2nd order estimate of noise in image background level */
	double *noise3,     /* 3rd order estimate of noise in image background level */
	double *noise5,     /* 5th order estimate of noise in image background level */
	int *status)        /* error status */

/*
    Compute statistics of the input integer image.
*/
{
	long ngood;
	int minval = 0, maxval = 0;
	double xmean = 0., xsigma = 0., xnoise = 0., xnoise2 = 0., xnoise3 = 0., xnoise5 = 0.;

	/* need to calculate mean and/or sigma and/or limits? */
	if (mean || sigma ) {
		FnMeanSigma_int(array, nx * ny, nullcheck, nullvalue, 
			&ngood, &xmean, &xsigma, status);

	    if (ngoodpix) *ngoodpix = ngood;
	    if (mean)     *mean = xmean;
	    if (sigma)    *sigma = xsigma;
	}

	if (noise1) {
		FnNoise1_int(array, nx, ny, nullcheck, nullvalue, 
		  &xnoise, status);

		*noise1  = xnoise;
	}

	if (minvalue || maxvalue || noise3) {
		FnNoise5_int(array, nx, ny, nullcheck, nullvalue, 
			&ngood, &minval, &maxval, &xnoise2, &xnoise3, &xnoise5, status);

		if (ngoodpix) *ngoodpix = ngood;
		if (minvalue) *minvalue= minval;
		if (maxvalue) *maxvalue = maxval;
		if (noise2) *noise2  = xnoise2;
		if (noise3) *noise3  = xnoise3;
		if (noise5) *noise5  = xnoise5;
	}
	return(*status);
}